

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O3

void __thiscall HighsNodeQueue::link_domchgs(HighsNodeQueue *this,int64_t node)

{
  pointer pOVar1;
  long lVar2;
  NodeSetArray *pNVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  pair<std::_Rb_tree_iterator<std::pair<double,_long>_>,_bool> pVar7;
  double val;
  int64_t local_48;
  NodeSetArray *local_40;
  double local_38;
  
  pOVar1 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start + node;
  uVar5 = (ulong)((long)*(pointer *)
                         ((long)&(pOVar1->domchgstack).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl + 8) -
                 *(long *)&(pOVar1->domchgstack).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl) >> 4;
  iVar4 = (int)uVar5;
  local_48 = node;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::resize(&pOVar1->domchglinks,(long)iVar4);
  if (iVar4 != 0) {
    local_40 = &this->colUpperNodesPtr;
    uVar5 = uVar5 & 0xffffffff;
    lVar6 = 0;
    do {
      lVar2 = *(long *)&(this->nodes).
                        super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                        ._M_impl.super__Vector_impl_data._M_start[node].domchgstack.
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl;
      local_38 = *(double *)(lVar2 + lVar6 * 2);
      iVar4 = *(int *)(lVar2 + 0xc + lVar6 * 2);
      pNVar3 = &this->colLowerNodesPtr;
      if ((iVar4 == 0) || (pNVar3 = local_40, iVar4 == 1)) {
        pVar7 = std::
                _Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                ::_M_emplace_unique<double&,long&>
                          ((_Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                            *)((pNVar3->_M_t).
                               super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                               .
                               super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                               ._M_head_impl + *(int *)(lVar2 + 8 + lVar6 * 2)),&local_38,&local_48)
        ;
        *(_Base_ptr *)
         (*(long *)&(this->nodes).
                    super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_48].domchglinks.
                    super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                    ._M_impl.super__Vector_impl_data + lVar6) = pVar7.first._M_node._M_node;
        node = local_48;
      }
      lVar6 = lVar6 + 8;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void HighsNodeQueue::link_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();
  nodes[node].domchglinks.resize(numchgs);

  for (HighsInt i = 0; i != numchgs; ++i) {
    double val = nodes[node].domchgstack[i].boundval;
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        nodes[node].domchglinks[i] =
            colLowerNodesPtr.get()[col].emplace(val, node).first;
        break;
      case HighsBoundType::kUpper:
        nodes[node].domchglinks[i] =
            colUpperNodesPtr.get()[col].emplace(val, node).first;
    }
  }
}